

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O1

int pcap_offline_read(pcap_t *p,int cnt,pcap_handler callback,u_char *user)

{
  bpf_insn *pc;
  int iVar1;
  u_int uVar2;
  char cVar3;
  int iVar4;
  int unaff_R14D;
  u_char *data;
  pcap_pkthdr h;
  u_char *local_60;
  pcap_handler local_58;
  u_char *local_50;
  pcap_pkthdr local_48;
  
  iVar1 = 0;
  iVar4 = 0;
  local_58 = callback;
  local_50 = user;
  do {
    if (iVar1 != 0) goto LAB_00116e08;
    if (p->break_loop == 0) {
      iVar1 = (*p->next_packet_op)(p,&local_48,&local_60);
      if (iVar1 == 0) {
        pc = (p->fcode).bf_insns;
        if ((pc == (bpf_insn *)0x0) ||
           (uVar2 = bpf_filter(pc,local_60,local_48.len,local_48.caplen), uVar2 != 0)) {
          (*local_58)(local_50,&local_48,local_60);
          iVar4 = iVar4 + 1;
          iVar1 = 0;
          cVar3 = (cnt <= iVar4) * '\x03';
          if (cnt < 1) {
            cVar3 = '\0';
          }
        }
        else {
          iVar1 = 0;
          cVar3 = '\0';
        }
      }
      else if (iVar1 == 1) {
        unaff_R14D = 0;
        cVar3 = '\x01';
      }
      else {
        unaff_R14D = iVar1;
        cVar3 = '\x01';
      }
    }
    else {
      cVar3 = '\x01';
      if (iVar4 == 0) {
        p->break_loop = 0;
        iVar1 = 0;
        iVar4 = 0;
        unaff_R14D = -2;
      }
      else {
        iVar1 = 0;
        unaff_R14D = iVar4;
      }
    }
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
LAB_00116e08:
    unaff_R14D = iVar4;
  }
  return unaff_R14D;
}

Assistant:

int
pcap_offline_read(pcap_t *p, int cnt, pcap_handler callback, u_char *user)
{
	struct bpf_insn *fcode;
	int status = 0;
	int n = 0;
	u_char *data;

	while (status == 0) {
		struct pcap_pkthdr h;

		/*
		 * Has "pcap_breakloop()" been called?
		 * If so, return immediately - if we haven't read any
		 * packets, clear the flag and return -2 to indicate
		 * that we were told to break out of the loop, otherwise
		 * leave the flag set, so that the *next* call will break
		 * out of the loop without having read any packets, and
		 * return the number of packets we've processed so far.
		 */
		if (p->break_loop) {
			if (n == 0) {
				p->break_loop = 0;
				return (-2);
			} else
				return (n);
		}

		status = p->next_packet_op(p, &h, &data);
		if (status) {
			if (status == 1)
				return (0);
			return (status);
		}

		if ((fcode = p->fcode.bf_insns) == NULL ||
		    bpf_filter(fcode, data, h.len, h.caplen)) {
			(*callback)(user, &h, data);
			if (++n >= cnt && cnt > 0)
				break;
		}
	}
	/*XXX this breaks semantics tcpslice expects */
	return (n);
}